

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O3

size_t drwav__write_u16ne_to_le(drwav *pWav,drwav_uint16 value)

{
  size_t sVar1;
  undefined1 local_2 [2];
  
  if (pWav == (drwav *)0x0) {
    __assert_fail("pWav != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/dr_wav.h"
                  ,0x908,"size_t drwav__write_u16ne_to_le(drwav *, drwav_uint16)");
  }
  if (pWav->onWrite != (drwav_write_proc)0x0) {
    sVar1 = (*pWav->onWrite)(pWav->pUserData,local_2,2);
    return sVar1;
  }
  __assert_fail("pWav->onWrite != __null",
                "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/dr_wav.h",
                0x909,"size_t drwav__write_u16ne_to_le(drwav *, drwav_uint16)");
}

Assistant:

static size_t drwav__write_u16ne_to_le(drwav* pWav, drwav_uint16 value)
{
    DRWAV_ASSERT(pWav          != NULL);
    DRWAV_ASSERT(pWav->onWrite != NULL);

    if (!drwav__is_little_endian()) {
        value = drwav__bswap16(value);
    }

    return drwav__write(pWav, &value, 2);
}